

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

void duckdb::IsHistogramOtherBinFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  reference pvVar2;
  duckdb *this;
  Vector ref;
  Value v;
  Vector aVStack_c8 [104];
  duckdb local_60 [64];
  
  this = (duckdb *)aVStack_c8;
  pvVar2 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
  bVar1 = SupportsOtherBucket((LogicalType *)(pvVar2 + 8));
  if (bVar1) {
    OtherBucketValue(local_60,(LogicalType *)(pvVar2 + 8));
    duckdb::Vector::Vector(aVStack_c8,(Value *)local_60);
    pvVar2 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
    duckdb::VectorOperations::NotDistinctFrom(pvVar2,aVStack_c8,result,*(ulong *)(args + 0x18));
    Vector::~Vector(aVStack_c8);
    this = local_60;
  }
  else {
    duckdb::Value::BOOLEAN(SUB81(aVStack_c8,0));
    duckdb::Vector::Reference((Value *)result);
  }
  duckdb::Value::~Value((Value *)this);
  return;
}

Assistant:

static void IsHistogramOtherBinFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input_type = args.data[0].GetType();
	if (!SupportsOtherBucket(input_type)) {
		result.Reference(Value::BOOLEAN(false));
		return;
	}
	auto v = OtherBucketValue(input_type);
	Vector ref(v);
	VectorOperations::NotDistinctFrom(args.data[0], ref, result, args.size());
}